

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setType(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this,Type tp)

{
  SPxOut *pSVar1;
  char *t;
  Verbosity old_verbosity;
  Verbosity local_1c;
  
  if (this->theType != tp) {
    this->theType = tp;
    forceRecompNonbasicValue(this);
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x77])(this);
    pSVar1 = this->spxout;
    if ((pSVar1 != (SPxOut *)0x0) && (local_1c = pSVar1->m_verbosity, 4 < (int)local_1c)) {
      (*pSVar1->_vptr_SPxOut[2])();
      pSVar1 = soplex::operator<<(this->spxout,"Switching to ");
      t = "entering";
      if (tp == LEAVE) {
        t = "leaving";
      }
      pSVar1 = soplex::operator<<(pSVar1,t);
      pSVar1 = soplex::operator<<(pSVar1," algorithm");
      std::endl<char,std::char_traits<char>>(pSVar1->m_streams[pSVar1->m_verbosity]);
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_1c);
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::setType(Type tp)
{

   if(theType != tp)
   {
      theType = tp;

      forceRecompNonbasicValue();

      unInit();
#if 0
      else
      {
         if(!matrixIsSetup)
         {
            SPxBasisBase<R>::load(this);
            // SPxBasisBase<R>::load(desc());
            // not needed, because load(this) allready loads descriptor
         }

         factorized = false;
         m_numCycle = 0;
#endif
         SPX_MSG_INFO3((*spxout), (*spxout) << "Switching to "
                       << static_cast<const char*>((tp == LEAVE)
                             ? "leaving" : "entering")
                       << " algorithm" << std::endl;)
      }
   }